

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

void __thiscall sector_t::ClosestPoint(sector_t *this,DVector2 *in,DVector2 *out)

{
  vertex_t *pvVar1;
  vertex_t *pvVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar13;
  double dVar14;
  undefined1 auVar12 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  
  if ((long)this->linecount < 1) {
    dVar8 = 0.0;
    dVar9 = 0.0;
  }
  else {
    dVar8 = 0.0;
    dVar9 = 0.0;
    dVar7 = INFINITY;
    lVar5 = 0;
    do {
      pvVar1 = this->lines[lVar5]->v1;
      pvVar2 = this->lines[lVar5]->v2;
      dVar11 = (pvVar2->p).X;
      dVar14 = (pvVar2->p).Y;
      dVar3 = (pvVar1->p).X;
      dVar4 = (pvVar1->p).Y;
      dVar15 = dVar11 - dVar3;
      dVar16 = dVar14 - dVar4;
      dVar17 = dVar16 * dVar16 + dVar15 * dVar15;
      dVar10 = dVar3;
      dVar13 = dVar4;
      if ((((dVar17 != 0.0) || (NAN(dVar17))) &&
          (dVar17 = ((in->Y - dVar4) * dVar16 + (in->X - dVar3) * dVar15) / dVar17, 0.0 < dVar17))
         && (dVar10 = dVar11, dVar13 = dVar14, dVar17 < 1.0)) {
        dVar10 = dVar3 + dVar15 * dVar17;
        dVar13 = dVar4 + dVar16 * dVar17;
      }
      dVar11 = dVar10 - in->X;
      dVar14 = dVar13 - in->Y;
      dVar11 = dVar14 * dVar14 + dVar11 * dVar11;
      uVar6 = (uint)(dVar11 < dVar7);
      auVar12._0_8_ = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f);
      auVar12._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
      auVar12._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
      dVar8 = (double)(~auVar12._0_8_ & (ulong)dVar8 | (ulong)dVar10 & auVar12._0_8_);
      dVar9 = (double)(~auVar12._8_8_ & (ulong)dVar9 | (ulong)dVar13 & auVar12._8_8_);
      if (dVar7 <= dVar11) {
        dVar11 = dVar7;
      }
      dVar7 = dVar11;
      lVar5 = lVar5 + 1;
    } while (this->linecount != lVar5);
  }
  out->X = dVar8;
  out->Y = dVar9;
  return;
}

Assistant:

void sector_t::ClosestPoint(const DVector2 &in, DVector2 &out) const
{
	int i;
	double x = in.X, y = in.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;

	for (i = 0; i < linecount; ++i)
	{
		vertex_t *v1 = lines[i]->v1;
		vertex_t *v2 = lines[i]->v2;
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
		}
	}
	out = { bestx, besty };
}